

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

request_t * new_request(bsc_step_t step)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  request_t *prVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined8 *puVar12;
  ulong uVar13;
  undefined8 *puVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  
  bVar20 = 0;
  if (step < bsc_s_bsc) {
    bsp_abort("bsc: a flush sync is required before posting another request. Requested superstep %d comes before current step %d\n"
              ,step);
  }
  uVar8 = step - bsc_s_bsc;
  if ((DAT_0011e38c <= uVar8) ||
     (DAT_0011e390 <=
      *(uint *)((long)DAT_0011e398 + ((ulong)(DAT_0011e394 + uVar8) % (ulong)DAT_0011e38c) * 4))) {
    uVar10 = uVar8 + 1;
    if (uVar8 + 1 < DAT_0011e38c * 2) {
      uVar10 = DAT_0011e38c * 2;
    }
    if (uVar8 < DAT_0011e38c) {
      uVar10 = DAT_0011e38c;
    }
    if (uVar10 <= uVar8) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    pvVar4 = calloc((ulong)uVar10,4);
    if (pvVar4 == (void *)0x0) {
      bsp_abort("bsc: insufficient memory; cannot allocate %u x %u bytes\n",(ulong)uVar10,4);
    }
    pvVar2 = DAT_0011e398;
    iVar1 = DAT_0011e394;
    uVar18 = DAT_0011e38c;
    uVar15 = (ulong)DAT_0011e38c;
    if (uVar15 == 0) {
      uVar3 = 0;
    }
    else {
      uVar13 = 0;
      do {
        *(undefined4 *)((long)pvVar4 + uVar13 * 4) =
             *(undefined4 *)((long)pvVar2 + ((ulong)(uint)(iVar1 + (int)uVar13) % uVar15) * 4);
        uVar13 = uVar13 + 1;
      } while (uVar15 != uVar13);
      uVar3 = *(uint *)((long)pvVar4 + (ulong)uVar8 * 4);
    }
    uVar17 = uVar3 + 1;
    if (uVar3 + 1 < DAT_0011e390 * 2) {
      uVar17 = DAT_0011e390 * 2;
    }
    if (uVar3 < DAT_0011e390) {
      uVar17 = DAT_0011e390;
    }
    if (uVar17 <= uVar3) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
      uVar18 = DAT_0011e38c;
    }
    pvVar5 = calloc((ulong)uVar17 * (ulong)uVar10,0x58);
    pvVar2 = DAT_0011e3a0;
    iVar1 = DAT_0011e394;
    uVar3 = DAT_0011e390;
    if (uVar18 != 0) {
      uVar15 = (ulong)DAT_0011e390;
      uVar16 = 0;
      uVar9 = 0;
      do {
        if (uVar15 != 0) {
          iVar19 = 0;
          uVar13 = uVar15;
          uVar11 = uVar16;
          do {
            puVar12 = (undefined8 *)
                      ((ulong)(((iVar1 + uVar9) % uVar18) * uVar3 + iVar19) * 0x58 + (long)pvVar2);
            puVar14 = (undefined8 *)((ulong)uVar11 * 0x58 + (long)pvVar5);
            for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar14 = *puVar12;
              puVar12 = puVar12 + (ulong)bVar20 * -2 + 1;
              puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
            }
            iVar19 = iVar19 + 1;
            uVar11 = uVar11 + 1;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar9 = uVar9 + 1;
        uVar16 = uVar16 + uVar17;
      } while (uVar9 != uVar18);
    }
    free(DAT_0011e398);
    free(DAT_0011e3a0);
    DAT_0011e394 = 0;
    DAT_0011e38c = uVar10;
    DAT_0011e390 = uVar17;
    DAT_0011e398 = pvVar4;
    DAT_0011e3a0 = pvVar5;
  }
  uVar15 = (ulong)(DAT_0011e394 + uVar8) % (ulong)DAT_0011e38c;
  uVar8 = *(uint *)((long)DAT_0011e398 + uVar15 * 4);
  prVar6 = (request_t *)
           ((long)DAT_0011e3a0 + (ulong)uVar8 * 0x58 + (ulong)(DAT_0011e390 * (int)uVar15) * 0x58);
  *(uint *)((long)DAT_0011e398 + uVar15 * 4) = uVar8 + 1;
  DAT_0011e3a8 = DAT_0011e3a8 + 1;
  return prVar6;
}

Assistant:

static request_t * new_request( bsc_step_t step ) 
{
    unsigned i, j, delay;
    request_t * entry;
    state_t * const sbsc = bsc();

    if ( step < sbsc->current )
        bsp_abort("bsc: a flush sync is required before posting"
                  " another request. Requested superstep %d comes before current step %d\n",
                  step, sbsc->current );

    delay = step - sbsc->current;
    if ( delay >= sbsc->horizon || 
          sbsc->n_requests[ (sbsc->queue_start + delay) % sbsc->horizon ] 
            >= sbsc->max_requests_per_step ) {

        /* new memory allocation is necessary */
        bsc_step_t new_horizon;
        unsigned * new_n_requests;
        unsigned new_max_requests;
        request_t * new_queue;

        new_horizon = sbsc->horizon;
        if (delay >= sbsc->horizon) {
            new_horizon = MAX( 2*sbsc->horizon, delay + 1);
        }

        if ( new_horizon <= delay )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
        
        new_n_requests = calloc( new_horizon, sizeof(unsigned));
        if ( ! new_n_requests ) 
            bsp_abort("bsc: insufficient memory; "
                      "cannot allocate %u x %u bytes\n",
                new_horizon, (unsigned) sizeof(unsigned) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            j = (sbsc->queue_start + i) % sbsc->horizon;
            new_n_requests[ i ] = sbsc->n_requests[j];
        }

        new_max_requests = sbsc->max_requests_per_step; 
        if (new_max_requests <= new_n_requests[delay]) 
            new_max_requests = MAX( 2 * sbsc->max_requests_per_step, 
                    new_n_requests[delay] + 1  );

        if ( new_max_requests <= new_n_requests[delay] )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
     
        new_queue = calloc( (size_t) new_horizon * new_max_requests, 
                            sizeof(request_t) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            for ( j = 0; j < sbsc->max_requests_per_step; ++j ){
                unsigned a = i * new_max_requests + j;
                unsigned b = (i + sbsc->queue_start) % sbsc->horizon 
                              * sbsc->max_requests_per_step + j;
                new_queue[ a ] = sbsc->queue[ b ];
            }
        }

        free( sbsc->n_requests );
        free( sbsc->queue );
        sbsc->n_requests = new_n_requests;
        sbsc->queue = new_queue;
        sbsc->horizon = new_horizon;
        sbsc->max_requests_per_step = new_max_requests;
        sbsc->queue_start = 0;
    }

    i = (delay + sbsc->queue_start) % sbsc->horizon;
    entry = sbsc->queue + i * 
        sbsc->max_requests_per_step + sbsc->n_requests[i] ;
    
    sbsc->n_requests[i] += 1;
    sbsc->total_n_outstanding_requests += 1;

    return entry;
}